

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CDirectiveData.cpp
# Opt level: O1

void __thiscall CDirectiveData::writeTempData(CDirectiveData *this,TempData *tempData)

{
  tDirectiveDataEntry *ptVar1;
  tByteListEntry *ptVar2;
  bool bVar3;
  wchar_t *pwVar4;
  uchar *args_1;
  size_t sVar5;
  ulong uVar6;
  int num;
  wstring result;
  int local_84;
  wstring local_80;
  unsigned_long local_60;
  wstring local_58;
  TempData *local_38;
  
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  local_58._M_string_length = 0;
  local_58.field_2._M_local_buf[0] = L'\0';
  sVar5 = this->UnitSize;
  local_38 = tempData;
  if (sVar5 == 4) {
    pwVar4 = L".word ";
  }
  else if (sVar5 == 2) {
    pwVar4 = L".halfword ";
  }
  else {
    if (sVar5 != 1) goto LAB_001416b2;
    pwVar4 = L".byte ";
  }
  std::__cxx11::wstring::_M_replace((ulong)&local_58,0,(wchar_t *)0x0,(ulong)pwVar4);
LAB_001416b2:
  if (this->TotalAmount != 0) {
    uVar6 = 0;
    do {
      ptVar1 = this->Entries;
      if (ptVar1[uVar6].String == true) {
        ptVar2 = (this->StrData).Entries;
        sVar5 = ptVar2[ptVar1[uVar6].num].len;
        if (sVar5 != 0) {
          args_1 = (this->StrData).Data + ptVar2[ptVar1[uVar6].num].Pos;
          do {
            local_60 = this->UnitSize * 2;
            formatString<unsigned_long,unsigned_char>(&local_80,L"0x%0*X,",&local_60,args_1);
            std::__cxx11::wstring::_M_append((wchar_t *)&local_58,(ulong)local_80._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
                 *)local_80._M_dataplus._M_p != &local_80.field_2) {
              operator_delete(local_80._M_dataplus._M_p);
            }
            args_1 = args_1 + 1;
            sVar5 = sVar5 - 1;
          } while (sVar5 != 0);
        }
      }
      else {
        bVar3 = evalExpression(this->ExpData + ptVar1[uVar6].num,&local_84,false);
        if (!bVar3) goto LAB_001417f3;
        local_60 = this->UnitSize * 2;
        formatString<unsigned_long,int>(&local_80,L"0x%0*X,",&local_60,&local_84);
        std::__cxx11::wstring::_M_append((wchar_t *)&local_58,(ulong)local_80._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
             *)local_80._M_dataplus._M_p != &local_80.field_2) {
          operator_delete(local_80._M_dataplus._M_p);
        }
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 < this->TotalAmount);
  }
  std::__cxx11::wstring::pop_back();
  TempData::writeLine(local_38,this->RamPos,&local_58);
LAB_001417f3:
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  return;
}

Assistant:

void CDirectiveData::writeTempData(TempData& tempData)
{
	int num;

	std::wstring result;
	switch (UnitSize)
	{
	case 1:
		result = L".byte ";
		break;
	case 2:
		result = L".halfword ";
		break;
	case 4:
		result = L".word ";
		break;
	}

	for (size_t i = 0; i < TotalAmount; i++)
	{
		if (Entries[i].String == true)
		{
			unsigned char* Data = StrData.GetEntry(Entries[i].num);
			size_t len = StrData.GetLen(Entries[i].num);
			for (size_t i = 0; i < len; i++)
			{
				result += formatString(L"0x%0*X,",UnitSize*2,Data[i]);
			}
		} else {
			if (evalExpression(ExpData[Entries[i].num],num) == false)
				return;
			result += formatString(L"0x%0*X,",UnitSize*2,num);
		}
	}

	result.pop_back();
	tempData.writeLine(RamPos,result);
}